

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetAllNetworks(Registry *this,NetworkArray *aRet)

{
  PersistentStorage *pPVar1;
  Status SVar2;
  int iVar3;
  Network NStack_78;
  
  pPVar1 = this->mStorage;
  Network::Network(&NStack_78);
  iVar3 = (*pPVar1->_vptr_PersistentStorage[0x16])(pPVar1,&NStack_78,aRet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)NStack_78.mMlp._M_dataplus._M_p != &NStack_78.mMlp.field_2) {
    operator_delete(NStack_78.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)NStack_78.mName._M_dataplus._M_p != &NStack_78.mName.field_2) {
    operator_delete(NStack_78.mName._M_dataplus._M_p);
  }
  SVar2 = kNotFound;
  if ((char)iVar3 != '\x01') {
    SVar2 = ((char)iVar3 != '\0') << 2;
  }
  return SVar2;
}

Assistant:

Registry::Status Registry::GetAllNetworks(NetworkArray &aRet)
{
    Registry::Status status;

    status = MapStatus(mStorage->Lookup(Network{}, aRet));

    return status;
}